

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpRepeatedVarintT<true,bool,(unsigned_short)0>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  undefined1 auVar4 [12];
  bool bVar5;
  void *pvVar6;
  RepeatedField<bool> *this;
  ulong uVar7;
  char *pcVar8;
  uint32_t *data_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar9;
  uint uVar10;
  ParseContext *ctx_00;
  ulong uVar11;
  Arena *this_00;
  uint *puVar12;
  ulong uVar13;
  long *plVar14;
  byte *p;
  pair<const_char_*,_unsigned_int> pVar15;
  int local_58;
  int local_50;
  int local_40;
  Arena *local_38;
  
  puVar12 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar12 & 3) != 0) {
    AlignFail(puVar12);
  }
  uVar3 = *(ushort *)((long)puVar12 + 10);
  pvVar6 = MaybeGetSplitBase(msg,true,table);
  plVar14 = (long *)((ulong)*puVar12 + (long)pvVar6);
  if (((ulong)plVar14 & 7) != 0) {
    AlignFail(plVar14);
  }
  this = (RepeatedField<bool> *)*plVar14;
  if (this == (RepeatedField<bool> *)kZeroBuffer) {
    this_00 = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)this_00 & 1) != 0) {
      this_00 = *(Arena **)((ulong)this_00 & 0xfffffffffffffffe);
    }
    if (this_00 == (Arena *)0x0) {
      this = (RepeatedField<bool> *)operator_new(0x10);
      RepeatedField<bool>::RepeatedField(this,(Arena *)0x0);
    }
    else {
      pvVar6 = Arena::Allocate(this_00,0x10);
      local_38 = this_00;
      this = Arena::InternalHelper<google::protobuf::RepeatedField<bool>>::
             Construct<google::protobuf::Arena*>(pvVar6,&local_38);
    }
    *plVar14 = (long)this;
  }
  if ((uVar3 >> 10 & 1) == 0) {
    data_00 = (uint32_t *)0x0;
  }
  else {
    data_00 = *(uint32_t **)
               ((long)&table->has_bits_offset +
               (ulong)(ushort)puVar12[2] * 8 + (ulong)table->aux_offset);
  }
  do {
    uVar13 = (ulong)*ptr;
    if ((long)uVar13 < 0) {
      uVar7 = (long)ptr[1] << 7 | 0x7f;
      if ((long)uVar7 < 0) {
        aVar9.data = (long)ptr[2] << 0xe | 0x3fff;
        if ((long)aVar9 < 0) {
          uVar7 = uVar7 & ((long)ptr[3] << 0x15 | 0x1fffffU);
          if ((long)uVar7 < 0) {
            pcVar8 = (char *)0xffffffffffffff80;
            aVar9.data = aVar9.data & ((long)ptr[4] << 0x1c | 0xfffffffU);
            if ((long)aVar9.data < 0) {
              uVar7 = uVar7 & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
              if ((long)uVar7 < 0) {
                aVar9.data = aVar9.data & ((long)ptr[6] << 0x2a | 0x3ffffffffffU);
                if ((long)aVar9 < 0) {
                  uVar7 = uVar7 & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
                  if ((long)uVar7 < 0) {
                    uVar11 = (ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff;
                    aVar9.data = aVar9.data & uVar11;
                    if ((long)aVar9 < 0) {
                      p = (byte *)(ptr + 10);
                      bVar1 = ptr[9];
                      ctx_00 = (ParseContext *)CONCAT71((int7)(uVar11 >> 8),bVar1);
                      if (bVar1 != 1) {
                        if ((char)bVar1 < '\0') goto LAB_002cc7be;
                        if ((bVar1 & 1) == 0) {
                          aVar9.data = aVar9.data ^ 0x8000000000000000;
                        }
                      }
                    }
                    else {
                      p = (byte *)(ptr + 9);
                    }
                  }
                  else {
                    p = (byte *)(ptr + 8);
                  }
                }
                else {
                  p = (byte *)(ptr + 7);
                }
              }
              else {
                p = (byte *)(ptr + 6);
              }
            }
            else {
              p = (byte *)(ptr + 5);
            }
          }
          else {
            p = (byte *)(ptr + 4);
          }
        }
        else {
          p = (byte *)(ptr + 3);
        }
        uVar7 = uVar7 & aVar9.data;
      }
      else {
        p = (byte *)(ptr + 2);
      }
      uVar13 = uVar13 & uVar7;
    }
    else {
      p = (byte *)(ptr + 1);
    }
    uVar10 = (uint)uVar13;
    if ((uVar3 >> 10 & 1) == 0) {
      if ((uVar3 & 0x600) == 0x200) {
        uVar13 = (ulong)(int)(-(uVar10 & 1) ^ (uint)(uVar13 >> 1) & 0x7fffffff);
      }
    }
    else if ((uVar3 & 0x600) == 0x600) {
      local_58 = (int)data_00;
      if (((int)uVar10 < local_58) ||
         (local_40 = (int)((ulong)data_00 >> 0x20), local_40 < (int)uVar10)) {
LAB_002cc78f:
        pcVar8 = MpUnknownEnumFallback(msg,ptr,ctx,data,table,hasbits);
        return pcVar8;
      }
    }
    else {
      bVar5 = ValidateEnum(uVar10,data_00);
      if (!bVar5) goto LAB_002cc78f;
    }
    RepeatedField<bool>::Add(this,uVar13 != 0);
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) break;
    bVar1 = *p;
    auVar4[8] = bVar1;
    auVar4._0_8_ = p + 1;
    auVar4._9_3_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = p[1];
      aVar9.data = (ulong)bVar2 << 7;
      uVar10 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pcVar8 = (char *)(ulong)uVar10;
        pVar15 = ReadTagFallback((char *)p,uVar10);
        auVar4 = pVar15._0_12_;
        ctx_00 = pVar15._8_8_;
        if (pVar15.first == (char *)0x0) {
LAB_002cc7be:
          pcVar8 = Error(msg,pcVar8,ctx_00,(TcFieldData)aVar9,table,hasbits);
          return pcVar8;
        }
      }
      else {
        auVar4._8_4_ = uVar10;
        auVar4._0_8_ = p + 2;
      }
    }
    ptr = auVar4._0_8_;
    local_50 = data.field_0._0_4_;
  } while (auVar4._8_4_ == local_50);
  if ((ulong)table->has_bits_offset != 0) {
    puVar12 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar12 & 3) != 0) {
      AlignFail();
    }
    *puVar12 = *puVar12 | (uint)hasbits;
  }
  return (char *)p;
}

Assistant:

const char* TcParser::MpRepeatedVarintT(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  // For is_split we ignore the incoming xform_val and read it from entry to
  // reduce duplication for the uncommon paths.
  const uint16_t xform_val =
      is_split ? (entry.type_card & field_layout::kTvMask) : xform_val_in;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  const char* ptr2 = ptr;
  uint32_t next_tag;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  auto& field = MaybeCreateRepeatedFieldRefAt<FieldType, is_split>(
      base, entry.offset, msg);

  TcParseTableBase::FieldAux aux;
  if (is_validated_enum) {
    aux = *table->field_aux(&entry);
    PrefetchEnumData(xform_val, aux);
  }

  do {
    uint64_t tmp;
    ptr = ParseVarint(ptr2, &tmp);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (is_validated_enum) {
      if (!EnumIsValidAux(static_cast<int32_t>(tmp), xform_val, aux)) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = sizeof(FieldType) == 8 ? WireFormatLite::ZigZagDecode64(tmp)
                                   : WireFormatLite::ZigZagDecode32(tmp);
    }
    field.Add(static_cast<FieldType>(tmp));
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);

parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}